

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::PushClipRect
          (ImDrawList *this,ImVec2 cr_min,ImVec2 cr_max,bool intersect_with_current_clip_rect)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ImVec4 *__src;
  float fVar3;
  ImVec2 IVar4;
  ImVec4 *pIVar5;
  int iVar6;
  int iVar7;
  undefined7 in_register_00000031;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float local_48;
  ImVec2 local_38;
  float local_28;
  
  local_28 = cr_max.x;
  local_48 = cr_max.y;
  local_38.x = cr_min.x;
  local_38.y = cr_min.y;
  iVar6 = (this->_ClipRectStack).Size;
  fVar8 = local_48;
  IVar4 = cr_min;
  if ((int)CONCAT71(in_register_00000031,intersect_with_current_clip_rect) == 0) {
LAB_00128442:
    local_38 = IVar4;
    local_48 = fVar8;
    if (iVar6 != (this->_ClipRectStack).Capacity) {
LAB_00128472:
      pIVar5 = (this->_ClipRectStack).Data;
      goto LAB_001284de;
    }
    if (iVar6 == 0) {
      iVar6 = 8;
      iVar7 = 1;
    }
    else {
      iVar7 = iVar6 + 1;
      iVar6 = iVar6 / 2 + iVar6;
    }
  }
  else {
    if (iVar6 != 0) {
      pIVar5 = (this->_ClipRectStack).Data;
      uVar1 = pIVar5[(long)iVar6 + -1].x;
      uVar2 = pIVar5[(long)iVar6 + -1].y;
      auVar9._4_4_ = uVar2;
      auVar9._0_4_ = uVar1;
      auVar9._8_8_ = 0;
      auVar10._8_4_ = in_XMM0_Dc;
      auVar10._0_8_ = cr_min;
      auVar10._12_4_ = in_XMM0_Dd;
      auVar10 = maxps(auVar9,auVar10);
      fVar3 = pIVar5[(long)iVar6 + -1].z;
      if (local_28 <= pIVar5[(long)iVar6 + -1].z) {
        fVar3 = local_28;
      }
      fVar8 = pIVar5[(long)iVar6 + -1].w;
      IVar4 = auVar10._0_8_;
      local_28 = fVar3;
      if (local_48 <= pIVar5[(long)iVar6 + -1].w) {
        fVar8 = local_48;
      }
      goto LAB_00128442;
    }
    iVar6 = 0;
    if ((this->_ClipRectStack).Capacity != 0) goto LAB_00128472;
    iVar6 = 8;
    iVar7 = 1;
    local_38 = cr_min;
  }
  if (iVar7 < iVar6) {
    iVar7 = iVar6;
  }
  pIVar5 = (ImVec4 *)ImGui::MemAlloc((long)iVar7 << 4);
  __src = (this->_ClipRectStack).Data;
  if (__src != (ImVec4 *)0x0) {
    memcpy(pIVar5,__src,(long)(this->_ClipRectStack).Size << 4);
    ImGui::MemFree((this->_ClipRectStack).Data);
  }
  (this->_ClipRectStack).Data = pIVar5;
  (this->_ClipRectStack).Capacity = iVar7;
  iVar6 = (this->_ClipRectStack).Size;
LAB_001284de:
  pIVar5[iVar6].x = local_38.x;
  pIVar5[iVar6].y = local_38.y;
  pIVar5[iVar6].z =
       (float)(~-(uint)(local_28 <= local_38.x) & (uint)local_28 |
              -(uint)(local_28 <= local_38.x) & (uint)local_38.x);
  pIVar5[iVar6].w =
       (float)(~-(uint)(local_48 <= local_38.y) & (uint)local_48 |
              (uint)local_38.y & -(uint)(local_48 <= local_38.y));
  (this->_ClipRectStack).Size = (this->_ClipRectStack).Size + 1;
  UpdateClipRect(this);
  return;
}

Assistant:

void ImDrawList::PushClipRect(ImVec2 cr_min, ImVec2 cr_max, bool intersect_with_current_clip_rect)
{
    ImVec4 cr(cr_min.x, cr_min.y, cr_max.x, cr_max.y);
    if (intersect_with_current_clip_rect && _ClipRectStack.Size)
    {
        ImVec4 current = _ClipRectStack.Data[_ClipRectStack.Size-1];
        if (cr.x < current.x) cr.x = current.x;
        if (cr.y < current.y) cr.y = current.y;
        if (cr.z > current.z) cr.z = current.z;
        if (cr.w > current.w) cr.w = current.w;
    }
    cr.z = ImMax(cr.x, cr.z);
    cr.w = ImMax(cr.y, cr.w);

    _ClipRectStack.push_back(cr);
    UpdateClipRect();
}